

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void free_parser_working_data(Parser *p)

{
  uint32 *puVar1;
  Reduction *pRVar2;
  Shift *pSVar3;
  PNode *pPVar4;
  SNode *pSVar5;
  D_Reduction **__ptr;
  Reduction *pRVar6;
  Shift *pSVar7;
  PNode *pPVar8;
  SNode *pSVar9;
  ulong uVar10;
  
  free_old_nodes(p);
  free_old_nodes(p);
  free((p->pnode_hash).v);
  free((p->snode_hash).v);
  *(undefined8 *)&(p->snode_hash).n = 0;
  (p->snode_hash).all = (SNode *)0x0;
  (p->snode_hash).v = (SNode **)0x0;
  (p->snode_hash).i = 0;
  (p->snode_hash).m = 0;
  *(undefined8 *)&(p->pnode_hash).n = 0;
  (p->pnode_hash).all = (PNode *)0x0;
  (p->pnode_hash).v = (PNode **)0x0;
  (p->pnode_hash).i = 0;
  (p->pnode_hash).m = 0;
  (p->snode_hash).last_all = (SNode *)0x0;
  while (p->reductions_todo != (Reduction *)0x0) {
    pRVar6 = p->free_reductions;
    pRVar2 = pRVar6->next;
    pSVar9 = p->reductions_todo->snode;
    puVar1 = &pSVar9->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar9);
      pRVar6 = p->free_reductions;
    }
    free(pRVar6);
    p->free_reductions = pRVar2;
  }
  while (p->shifts_todo != (Shift *)0x0) {
    pSVar7 = p->free_shifts;
    pSVar3 = pSVar7->next;
    pSVar9 = p->shifts_todo->snode;
    puVar1 = &pSVar9->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar9);
      pSVar7 = p->free_shifts;
    }
    free(pSVar7);
    p->free_shifts = pSVar3;
  }
  pRVar6 = p->free_reductions;
  while (pRVar6 != (Reduction *)0x0) {
    pRVar2 = pRVar6->next;
    free(pRVar6);
    p->free_reductions = pRVar2;
    pRVar6 = pRVar2;
  }
  pSVar7 = p->free_shifts;
  while (pSVar7 != (Shift *)0x0) {
    pSVar3 = pSVar7->next;
    free(pSVar7);
    p->free_shifts = pSVar3;
    pSVar7 = pSVar3;
  }
  pPVar8 = p->free_pnodes;
  while (pPVar8 != (PNode *)0x0) {
    pPVar4 = pPVar8->all_next;
    free(pPVar8);
    p->free_pnodes = pPVar4;
    pPVar8 = pPVar4;
  }
  pPVar8 = (PNode *)p->free_znodes;
  while (pPVar8 != (PNode *)0x0) {
    pPVar4 = *(PNode **)&pPVar8->hash;
    free(pPVar8);
    p->free_znodes = (ZNode *)pPVar4;
    pPVar8 = pPVar4;
  }
  pSVar9 = p->free_snodes;
  while (pSVar9 != (SNode *)0x0) {
    pSVar5 = pSVar9->all_next;
    free(pSVar9);
    p->free_snodes = pSVar5;
    pSVar9 = pSVar5;
  }
  for (uVar10 = 0; __ptr = (p->error_reductions).v, uVar10 < (p->error_reductions).n;
      uVar10 = uVar10 + 1) {
    free(__ptr[uVar10]);
  }
  if (__ptr != (p->error_reductions).e && __ptr != (D_Reduction **)0x0) {
    free(__ptr);
  }
  (p->error_reductions).n = 0;
  (p->error_reductions).v = (D_Reduction **)0x0;
  if (p->whitespace_parser != (Parser *)0x0) {
    free_parser_working_data(p->whitespace_parser);
  }
  free(p->shift_results);
  p->shift_results = (ShiftResult *)0x0;
  p->nshift_results = 0;
  free(p->code_shifts);
  p->code_shifts = (D_Shift *)0x0;
  p->ncode_shifts = 0;
  return;
}

Assistant:

static void free_parser_working_data(Parser *p) {
  uint i;

  free_old_nodes(p);
  free_old_nodes(p); /* to catch SNodes saved for error repair */
  if (p->pnode_hash.v) FREE(p->pnode_hash.v);
  if (p->snode_hash.v) FREE(p->snode_hash.v);
  memset(&p->pnode_hash, 0, sizeof(p->pnode_hash));
  memset(&p->snode_hash, 0, sizeof(p->snode_hash));
  while (p->reductions_todo) {
    Reduction *r = p->free_reductions->next;
    unref_sn(p, p->reductions_todo->snode);
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->shifts_todo) {
    Shift *s = p->free_shifts->next;
    unref_sn(p, p->shifts_todo->snode);
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_reductions) {
    Reduction *r = p->free_reductions->next;
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->free_shifts) {
    Shift *s = p->free_shifts->next;
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_pnodes) {
    PNode *pn = p->free_pnodes->all_next;
    FREE(p->free_pnodes);
    p->free_pnodes = pn;
  }
  while (p->free_znodes) {
    ZNode *zn = znode_next(p->free_znodes);
    FREE(p->free_znodes);
    p->free_znodes = zn;
  }
  while (p->free_snodes) {
    SNode *sn = p->free_snodes->all_next;
    FREE(p->free_snodes);
    p->free_snodes = sn;
  }
  for (i = 0; i < p->error_reductions.n; i++) FREE(p->error_reductions.v[i]);
  vec_free(&p->error_reductions);
  if (p->whitespace_parser) free_parser_working_data(p->whitespace_parser);
  FREE(p->shift_results);
  p->shift_results = NULL;
  p->nshift_results = 0;
  FREE(p->code_shifts);
  p->code_shifts = NULL;
  p->ncode_shifts = 0;
}